

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcGlyphAttrMatrix.h
# Opt level: O2

void __thiscall
GrcGlyphAttrMatrix::GrcGlyphAttrMatrix
          (GrcGlyphAttrMatrix *this,size_t cGlyphIDs,size_t cGlyphAttrs,size_t cStyles)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  
  uVar7 = cGlyphAttrs * cGlyphIDs * cStyles;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar7;
  uVar2 = SUB168(auVar1 * ZEXT816(0x48),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  this->m_cGlyphAttrs = cGlyphAttrs;
  this->m_cGlyphIDs = cGlyphIDs;
  this->m_cStyles = cStyles;
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x48),8) == 0) {
    uVar2 = uVar3;
  }
  puVar4 = (ulong *)operator_new__(uVar2);
  *puVar4 = uVar7;
  if (uVar7 != 0) {
    puVar5 = puVar4 + 8;
    lVar6 = cStyles * cGlyphAttrs * cGlyphIDs * 0x48;
    do {
      puVar5[-7] = (ulong)&PTR__GrcAssignment_00211d10;
      *(undefined2 *)(puVar5 + -4) = 0;
      puVar5[-6] = 0;
      puVar5[-5] = 0;
      puVar5[-3] = 0xffffffffffffffff;
      puVar5[-2] = (ulong)puVar5;
      puVar5[-1] = 0;
      *(undefined1 *)puVar5 = 0;
      puVar5 = puVar5 + 9;
      lVar6 = lVar6 + -0x48;
    } while (lVar6 != 0);
  }
  this->m_prgasgnx = (GrcAssignment *)(puVar4 + 1);
  return;
}

Assistant:

GrcGlyphAttrMatrix(size_t cGlyphIDs, size_t cGlyphAttrs, size_t cStyles)
	{
		m_cGlyphAttrs = cGlyphAttrs;
		m_cGlyphIDs = cGlyphIDs;
		m_cStyles = cStyles;
		m_prgasgnx = new GrcAssignment[cGlyphIDs * cGlyphAttrs * cStyles];
	}